

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpperf.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int extraout_EAX;
  ulong uVar6;
  size_t sVar7;
  ssize_t sVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int canfd_on;
  timeval start_tv;
  canfd_frame frame;
  timeval timeo;
  timeval end_tv;
  sockaddr_can addr;
  fd_set rdfs;
  uint local_1f0;
  uint local_1ec;
  ulong local_1e8;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  ulong local_1d0;
  uint local_1c8;
  uint local_1c4;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  uint local_1a0;
  uint local_19c;
  int local_198;
  int local_194;
  undefined8 local_190;
  ulong local_188;
  long local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  long local_158;
  long local_150;
  uint local_148;
  byte local_144;
  byte local_143;
  byte local_140 [64];
  timeval local_100;
  long local_f0;
  long local_e8;
  sockaddr local_e0;
  fd_set local_c8;
  uint local_48;
  undefined4 local_44;
  uint local_40;
  undefined4 local_3c;
  
  local_1f0 = 1;
  local_1a8 = 0;
  local_1d0._0_4_ = 0xffffffff;
  local_1dc = 0xffffffff;
  local_1c4 = 0;
  uVar16 = 0;
  uVar6 = 0;
LAB_00101421:
  do {
    while (iVar3 = getopt(argc,argv,"s:d:x:X:?"), uVar15 = (uint)local_1d0, iVar3 == 0x58) {
      uVar6 = strtoul(_optarg,(char **)0x0,0x10);
      uVar6 = uVar6 & 0xff;
      uVar16 = 1;
    }
    local_1d4 = (uint)uVar6;
    if (iVar3 < 0x73) {
      if (iVar3 == -1) {
        if (((argc - _optind != 1) || ((uint)local_1d0 == 0xffffffff)) || (local_1dc == 0xffffffff))
        goto LAB_00101dec;
        uVar4 = socket(0x1d,3,1);
        if ((int)uVar4 < 0) {
          pcVar13 = "socket";
        }
        else {
          setsockopt(uVar4,0x65,5,&local_1f0,4);
          local_40 = 0x9fffffff;
          local_48 = uVar15 & 0x7ff;
          if ((int)uVar15 < 0) {
            local_48 = uVar15 & 0x9fffffff;
          }
          local_44 = 0xdfffffff;
          if ((int)uVar15 >= 0) {
            local_44 = 0xc00007ff;
          }
          if (-1 < (int)local_1dc) {
            local_40 = 0x7ff;
          }
          local_3c = 0xdfffffff;
          if (-1 < (int)local_1dc) {
            local_3c = 0xc00007ff;
          }
          local_40 = local_40 & local_1dc;
          setsockopt(uVar4,0x65,1,&local_48,0x10);
          local_e0.sa_family = 0x1d;
          local_e0.sa_data._2_4_ = if_nametoindex(argv[_optind]);
          if (local_e0.sa_data._2_4_ != 0) {
            iVar3 = bind(uVar4,&local_e0,0x18);
            if (iVar3 < 0) {
              perror("bind");
              return 1;
            }
            uVar18 = 1L << ((byte)uVar4 & 0x3f);
            local_1d0 = (ulong)(uVar4 >> 6);
            local_194 = uVar4 + 1;
            local_168 = uVar16 | 2;
            uVar15 = (uint)local_1a8;
            local_1b0 = local_1a8 & 0xffffffff;
            local_1c8 = uVar15 | 2;
            local_170 = local_1b0 | 2;
            local_178 = local_1b0 | 4;
            local_1a0 = uVar15 | 6;
            local_19c = uVar15 + 1;
            local_180 = (long)(int)~uVar15;
            local_1c0 = 0;
            uVar6 = 0;
            uVar15 = 0;
            local_1e8 = 0;
            local_1d8 = 0;
            local_1b8 = 0;
            local_190 = 0;
            local_188 = 0;
            local_1ec = uVar4;
            local_198 = (int)uVar16;
            local_160 = uVar16;
            break;
          }
          pcVar13 = "if_nametoindex";
          local_e0.sa_data[2] = '\0';
          local_e0.sa_data[3] = '\0';
          local_e0.sa_data[4] = '\0';
          local_e0.sa_data[5] = '\0';
        }
        perror(pcVar13);
        return 1;
      }
      if (iVar3 != 100) {
        if (iVar3 == 0x3f) {
          main_cold_1();
        }
LAB_00101de2:
        main_cold_3();
LAB_00101dec:
        main_cold_2();
        return extraout_EAX;
      }
      uVar6 = strtoul(_optarg,(char **)0x0,0x10);
      sVar7 = strlen(_optarg);
      local_1dc = (uint)uVar6 | 0x80000000;
      if (sVar7 < 8) {
        local_1dc = (uint)uVar6;
      }
    }
    else {
      if (iVar3 == 0x78) {
        uVar18 = strtoul(_optarg,(char **)0x0,0x10);
        local_1c4 = (uint)uVar18 & 0xff;
        local_1a8 = 1;
        goto LAB_00101421;
      }
      if (iVar3 != 0x73) goto LAB_00101de2;
      uVar6 = strtoul(_optarg,(char **)0x0,0x10);
      sVar7 = strlen(_optarg);
      local_1d0._0_4_ = (uint)uVar6 | 0x80000000;
      if (sVar7 < 8) {
        local_1d0._0_4_ = (uint)uVar6;
      }
    }
    uVar6 = (ulong)local_1d4;
  } while( true );
LAB_001016f2:
  local_c8.fds_bits[0xe] = 0;
  local_c8.fds_bits[0xf] = 0;
  local_c8.fds_bits[0xc] = 0;
  local_c8.fds_bits[0xd] = 0;
  local_c8.fds_bits[10] = 0;
  local_c8.fds_bits[0xb] = 0;
  local_c8.fds_bits[8] = 0;
  local_c8.fds_bits[9] = 0;
  local_c8.fds_bits[6] = 0;
  local_c8.fds_bits[7] = 0;
  local_c8.fds_bits[4] = 0;
  local_c8.fds_bits[5] = 0;
  local_c8.fds_bits[2] = 0;
  local_c8.fds_bits[3] = 0;
  local_c8.fds_bits[0] = 0;
  local_c8.fds_bits[1] = 0;
  local_c8.fds_bits[local_1d0] = local_c8.fds_bits[local_1d0] | uVar18;
  local_100.tv_sec = 1;
  local_100.tv_usec = 0;
  uVar5 = select(local_194,&local_c8,(fd_set *)0x0,(fd_set *)0x0,&local_100);
  uVar9 = uVar5;
  bVar2 = true;
  if (-1 < (int)uVar5) {
    if ((uVar6 == 0) || ((local_c8.fds_bits[local_1d0] & uVar18) != 0)) {
      sVar8 = read(uVar4,&local_148,0x48);
      uVar4 = local_1ec;
      uVar9 = (uint)sVar8;
      if ((int)uVar9 < 0) {
        perror("read");
        uVar4 = local_1ec;
      }
      else {
        uVar17 = uVar9 & 0x7fffffff;
        if ((uVar17 == 0x10) || (uVar17 == 0x48)) {
          if (uVar6 != 0) {
            uVar9 = uVar5;
            bVar2 = false;
            if ((uVar17 != 0x48 && local_1f0 != 0) || (uVar17 != 0x10 && local_1f0 == 0))
            goto LAB_00101d85;
          }
          if (((int)local_1a8 == 0) || (local_1c4 == local_140[0])) {
            if (local_148 == local_1dc) {
              if (((local_198 != 0) && (local_1d4 != local_140[0])) ||
                 ((local_140[local_160] & 0xf0) != 0x30)) goto LAB_00101819;
              local_188 = (ulong)local_140[local_160 + 1];
              local_190 = CONCAT71((int7)(local_168 >> 8),local_140[local_168]);
            }
            bVar1 = local_140[local_1b0];
            uVar9 = bVar1 & 0xfffffff0;
            if (uVar9 == 0x20) {
              if (uVar6 == 0) {
                uVar6 = 0;
              }
              else {
                uVar9 = bVar1 & 0xf;
                if (uVar9 == ((int)local_1c0 + 1U & 0xf)) {
                  uVar6 = uVar6 + local_180 + (ulong)local_144;
                  local_1c0 = (ulong)uVar9;
                }
              }
            }
            else if (uVar9 == 0x10) {
              uVar9 = (uint)local_140[local_1b0 + 1] | (bVar1 & 0xf) << 8;
              if (uVar9 == 0) {
                uVar16 = (ulong)local_140[local_1b0 + 5] |
                         (ulong)local_140[local_178] << 8 |
                         (long)(int)((uint)local_140[local_170] << 0x18) |
                         (ulong)local_140[local_1b0 + 3] << 0x10;
                uVar9 = local_1a0;
              }
              else {
                uVar16 = (ulong)uVar9;
                uVar9 = local_1c8;
              }
              if (0x418936 < uVar16) {
                uVar6 = 0;
                printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n",uVar16);
                fflush(_stdout);
                local_1e8 = 0;
                goto LAB_00101819;
              }
              uVar15 = 1;
              uVar6 = uVar16;
              if (9 < uVar16) {
                do {
                  uVar15 = uVar15 + 1;
                  uVar10 = (uint)uVar6;
                  uVar6 = (uVar6 & 0xffffffff) / 10;
                } while (99 < uVar10);
              }
              local_1d8 = (uint)local_144;
              uVar6 = (ulong)(int)(local_1d8 - uVar9);
              local_1b8 = (ulong)CONCAT31((int3)(uVar9 >> 8),local_143) & 0xffffffffffffff01;
              local_1e8 = uVar16;
              ioctl(local_1ec,0x8906,&local_158);
              local_1f0 = (uint)(uVar17 != 0x10);
              local_1c0 = 0;
            }
            else if ((bVar1 & 0xf0) == 0) {
              uVar16 = (ulong)bVar1 & 0xf;
              uVar15 = local_19c;
              if ((bVar1 & 0xf) == 0) {
                uVar16 = (ulong)local_140[local_1b0 + 1];
                uVar15 = local_1c8;
              }
              uVar6 = 0;
              if (uVar15 + uVar16 <= (ulong)local_144) {
                uVar6 = uVar16;
              }
              uVar15 = 1;
              uVar16 = uVar6;
              if (9 < uVar6) {
                do {
                  uVar15 = uVar15 + 1;
                  uVar9 = (uint)uVar16;
                  uVar16 = uVar16 / 10;
                } while (99 < uVar9);
              }
              local_1b8 = (ulong)local_143 & 0xffffffffffffff01;
              local_1d8 = (uint)local_144;
              if (local_144 < 9) {
                local_1d8 = 8;
              }
              ioctl(local_1ec,0x8906,&local_158);
              local_1e8 = uVar6;
              if (uVar17 == 0x10) {
                local_1f0 = 0;
              }
              else {
                local_1f0 = 1;
              }
            }
            if (uVar6 == 0) {
              uVar6 = 0;
            }
            else {
              if (local_1e8 <= uVar6) {
                uVar6 = local_1e8;
              }
              uVar4 = 0;
              uVar16 = (uVar6 * 100) / local_1e8;
              printf("\r %3lu%% ",uVar16,(uVar6 * 100) % local_1e8);
              putchar(0x7c);
              if (99 < uVar16) {
                uVar16 = 100;
              }
              do {
                iVar3 = 0x2e;
                if (uVar4 < ((uint)(uVar16 >> 1) & 0x7fffffff)) {
                  iVar3 = 0x58;
                }
                putchar(iVar3);
                uVar4 = uVar4 + 1;
              } while (uVar4 != 0x32);
              printf("| %*lu/%lu ",(ulong)uVar15,uVar6);
              uVar4 = local_1ec;
            }
            if (uVar6 == 0) {
              uVar6 = 0;
            }
            else if (local_1e8 <= uVar6) {
              pcVar13 = "CAN-FD";
              if (local_1f0 == 0) {
                pcVar13 = "CAN2.0";
              }
              uVar11 = 0x2a;
              if ((char)local_1b8 == '\0') {
                uVar11 = 0x20;
              }
              printf("\r%s %02d%c (BS:%2hhu # ",pcVar13,(ulong)(byte)local_1d8,uVar11,
                     local_188 & 0xff);
              uVar6 = local_1e8;
              if ((char)local_190 < '\0') {
                if ((byte)((char)local_190 + 0xfU) < 9) {
                  printf("STmin:%3u usec)",(ulong)(((uint)local_190 & 0xf) * 100));
                }
                else {
                  printf("STmin: invalid   )");
                }
              }
              else {
                printf("STmin:%3hhu msec)");
                uVar6 = local_1e8;
              }
              printf(" : %lu byte in ",uVar6);
              ioctl(uVar4,0x8906,&local_f0);
              lVar14 = local_e8 - local_150;
              lVar12 = lVar14 + 1000000;
              if (-1 < lVar14) {
                lVar12 = lVar14;
              }
              lVar14 = (lVar14 >> 0x3f) + (local_f0 - local_158);
              if (lVar14 < 0) {
                lVar12 = 0;
              }
              if (lVar14 < 1) {
                lVar14 = 0;
              }
              uVar16 = lVar12 / 1000 + lVar14 * 1000;
              if (uVar16 == 0) {
                printf("(no time available)     ");
              }
              else {
                printf("%llu.%06llus ",lVar14,lVar12);
                printf("=> %lu byte/s",(uVar6 * 1000) / uVar16,(uVar6 * 1000) % uVar16);
              }
              putchar(10);
              local_1e8 = 0;
              uVar6 = 0;
              uVar4 = local_1ec;
            }
            fflush(_stdout);
            goto LAB_00101d83;
          }
LAB_00101819:
          uVar9 = uVar5;
          bVar2 = false;
        }
        else {
          fprintf(_stderr,"read: incomplete CAN frame %zu %d\n",0x48);
          uVar4 = local_1ec;
          bVar2 = true;
        }
      }
    }
    else {
      local_1e8 = 0;
      printf("\r%-*s",0x4e," (transmission timed out)");
      fflush(_stdout);
      uVar6 = 0;
LAB_00101d83:
      uVar9 = uVar5;
      bVar2 = false;
    }
  }
LAB_00101d85:
  if (bVar2) {
    close(uVar4);
    return uVar9;
  }
  goto LAB_001016f2;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	int running = 1;
	struct sockaddr_can addr;
	struct can_filter rfilter[2];
	struct canfd_frame frame;
	int canfd_on = 1;
	int nbytes, i, ret;
	canid_t src = NO_CAN_ID;
	canid_t dst = NO_CAN_ID;
	int ext = 0;
	int extaddr = 0;
	int rx_ext = 0;
	int rx_extaddr = 0;
	int datidx = 0;
	unsigned char bs = 0;
	unsigned char stmin = 0;
	unsigned char brs = 0;
	unsigned char ll_dl = 0;
	unsigned long fflen = 0;
	unsigned fflen_digits = 0;
	unsigned long rcvlen = 0;
	unsigned long percent = 0;
	struct timeval start_tv, end_tv, diff_tv, timeo;
	unsigned int n_pci;
	unsigned int sn, last_sn = 0;
	int opt;

	while ((opt = getopt(argc, argv, "s:d:x:X:?")) != -1) {
		switch (opt) {
		case 's':
			src = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				src |= CAN_EFF_FLAG;
			break;

		case 'd':
			dst = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				dst |= CAN_EFF_FLAG;
			break;

		case 'x':
			ext = 1;
			extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'X':
			rx_ext = 1;
			rx_extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind) != 1 || src == NO_CAN_ID || dst == NO_CAN_ID) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	/* try to switch the socket into CAN FD mode */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfd_on, sizeof(canfd_on));

	/* set single CAN ID raw filters for src and dst frames */
	if (src & CAN_EFF_FLAG) {
		rfilter[0].can_id   = src & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[0].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[0].can_id   = src & CAN_SFF_MASK;
		rfilter[0].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	if (dst & CAN_EFF_FLAG) {
		rfilter[1].can_id   = dst & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[1].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[1].can_id   = dst & CAN_SFF_MASK;
		rfilter[1].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, &rfilter, sizeof(rfilter));

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(s, &rdfs);

		/* timeout for ISO TP transmissions */
		timeo.tv_sec  = 1;
		timeo.tv_usec = 0;

		if ((ret = select(s+1, &rdfs, NULL, NULL, &timeo)) < 0) {
			running = 0;
			continue;
		}

		/* detected timeout of already started transmission */
		if (rcvlen && !(FD_ISSET(s, &rdfs))) {
			printf("\r%-*s",78, " (transmission timed out)");
			fflush(stdout);
			fflen = rcvlen = 0;
			continue;
		}

		nbytes = read(s, &frame, sizeof(frame));
		if (nbytes < 0) {
			perror("read");
			ret = nbytes;
			running = 0;
			continue;
		}
		if (nbytes != CAN_MTU && nbytes != CANFD_MTU) {
			fprintf(stderr, "read: incomplete CAN frame %zu %d\n", sizeof(frame), nbytes);
			ret = nbytes;
			running = 0;
			continue;
		}

		if (rcvlen) {
			/* make sure to process only the detected PDU CAN frame type */
			if (canfd_on && (nbytes != CANFD_MTU))
				continue;
			if (!canfd_on && (nbytes != CAN_MTU))
				continue;
		}

			/* check extended address if provided */
			if (ext && extaddr != frame.data[0])
				continue;

			/* only get flow control information from dst CAN ID */
			if (frame.can_id == dst) {
				/* check extended address if provided */
				if (rx_ext && frame.data[0] != rx_extaddr)
					continue;

				n_pci = frame.data[rx_ext];
				/* check flow control PCI only */
				if ((n_pci & 0xF0) != 0x30)
					continue;

				bs = frame.data[rx_ext + 1];
				stmin = frame.data[rx_ext + 2];
			}

			/* data content starts and index datidx */
			datidx = 0;

			n_pci = frame.data[ext];
			switch (n_pci & 0xF0) {

			case 0x00:
				/* SF */
				if (n_pci & 0xF) {
					fflen = rcvlen = n_pci & 0xF;
					datidx = ext+1;
				} else {
					fflen = rcvlen = frame.data[ext + 1];
					datidx = ext+2;
				}

				/* ignore incorrect SF PDUs */
				if (frame.len < rcvlen + datidx)
					fflen = rcvlen = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;
				if (ll_dl < 8)
					ll_dl = 8;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x10:
				/* FF */
				fflen = ((n_pci & 0x0F)<<8) + frame.data[ext+1];
				if (fflen)
					datidx = ext+2;
				else {
					fflen = (frame.data[ext+2]<<24) +
						(frame.data[ext+3]<<16) +
						(frame.data[ext+4]<<8) +
						frame.data[ext+5];
					datidx = ext+6;
				}

				/* to increase the time resolution we multiply fflen with 1000 later */
				if (fflen >= (UINT32_MAX / 1000)) {
					printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n", fflen);
					fflush(stdout);
					fflen = rcvlen = 0;
					continue;
				}
				rcvlen = frame.len - datidx;
				last_sn = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x20:
				/* CF */
				if (rcvlen) {
					sn = n_pci & 0x0F;
					if (sn == ((last_sn + 1) & 0xF)) {
						last_sn = sn;
						datidx = ext+1;
						rcvlen += frame.len - datidx;
					}
				}
				break;

			default:
				break;
			}

			/* PDU reception in process */
			if (rcvlen) {
				if (rcvlen > fflen)
					rcvlen = fflen;

				percent = (rcvlen * 100 / fflen);
				printf("\r %3lu%% ", percent);

				printf("|");

				if (percent > 100)
					percent = 100;

				for (i=0; i < NUMBAR; i++){
					if (i < (int)(percent/PERCENTRES))
						printf("X");
					else
						printf(".");
				}
				printf("| %*lu/%lu ", fflen_digits, rcvlen, fflen);
			}

			/* PDU complete */
			if (rcvlen && rcvlen >= fflen) {

				printf("\r%s %02d%c (BS:%2hhu # ", canfd_on?"CAN-FD":"CAN2.0", ll_dl, brs?'*':' ', bs);
				if (stmin < 0x80)
					printf("STmin:%3hhu msec)", stmin);
				else if (stmin > 0xF0 && stmin < 0xFA)
					printf("STmin:%3u usec)", (stmin & 0xF) * 100);
				else
					printf("STmin: invalid   )");

				printf(" : %lu byte in ", fflen);

				/* calculate time */
				ioctl(s, SIOCGSTAMP, &end_tv);
				diff_tv.tv_sec  = end_tv.tv_sec  - start_tv.tv_sec;
				diff_tv.tv_usec = end_tv.tv_usec - start_tv.tv_usec;
				if (diff_tv.tv_usec < 0)
					diff_tv.tv_sec--, diff_tv.tv_usec += 1000000;
				if (diff_tv.tv_sec < 0)
					diff_tv.tv_sec = diff_tv.tv_usec = 0;

				/* check devisor to be not zero */
				if (diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000){
					printf("%llu.%06llus ", (unsigned long long)diff_tv.tv_sec, (unsigned long long)diff_tv.tv_usec);
					printf("=> %lu byte/s", (fflen * 1000) /
					       (unsigned long)(diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000));
				} else
					printf("(no time available)     ");

				printf("\n");
				/* wait for next PDU */
				fflen = rcvlen = 0;
			}
			fflush(stdout);
	}

	close(s);

	return ret;
}